

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  bool bVar1;
  SI_Error SVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  pointer eventParameter;
  bool bVar9;
  allocator local_2c9;
  EventRegistry *local_2c8;
  ulong local_2c0;
  string *local_2b8;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *local_2b0;
  long local_2a8;
  long local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  diskFiles;
  string extra_data;
  string client_signature;
  string to_date;
  string local_218;
  string from_date;
  string local_1d8;
  string local_1b8;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_198;
  FullLicenseInfo licInfo;
  
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8 = product;
  local_2b0 = licenseInfoOut;
  getLicenseDiskFiles(__return_storage_ptr__,this,&diskFiles);
  bVar1 = EventRegistry::isGood(__return_storage_ptr__);
  if (bVar1) {
    local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
    local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_198.m_pData = (char *)0x0;
    local_198.m_uDataLen = 0;
    local_198.m_pFileComment = (char *)0x0;
    local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_198.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_198.m_strings;
    local_198.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node._M_size._0_7_ = 0;
    local_198._95_4_ = 0;
    local_198.m_bSpaces = true;
    local_198.m_nOrder = 0;
    local_2c0 = 0;
    bVar1 = false;
    bVar9 = false;
    local_2c8 = __return_storage_ptr__;
    local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_198.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_198.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_198.m_strings.
         super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    for (eventParameter =
              diskFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = local_2c8,
        eventParameter !=
        diskFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; eventParameter = eventParameter + 1) {
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset(&local_198);
      SVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                        (&local_198,(eventParameter->_M_dataplus)._M_p);
      if (SVar2 < SI_OK) {
        EventRegistry::addEvent(local_2c8,FILE_FORMAT_NOT_RECOGNIZED,SVRT_WARN,eventParameter);
      }
      else {
        pcVar7 = (local_2b8->_M_dataplus)._M_p;
        iVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                          (&local_198,pcVar7);
        if (iVar3 < 1) {
          bVar9 = true;
          EventRegistry::addEvent(local_2c8,PRODUCT_NOT_LICENSED,SVRT_WARN,eventParameter);
        }
        else {
          pcVar4 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                             (&local_198,pcVar7,"license_signature",(char *)0x0,(bool *)0x0);
          lVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
                            (&local_198,pcVar7,"license_version",-1,(bool *)0x0);
          if (lVar5 < 1 || pcVar4 == (char *)0x0) {
            bVar1 = true;
            EventRegistry::addEvent(local_2c8,LICENSE_MALFORMED,SVRT_WARN,eventParameter);
            bVar9 = true;
          }
          else {
            local_2c0 = lVar5;
            pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                               (&local_198,pcVar7,"from_date",FullLicenseInfo::UNUSED_TIME,
                                (bool *)0x0);
            std::__cxx11::string::string((string *)&licInfo,pcVar6,(allocator *)&to_date);
            trim_copy(&from_date,&licInfo.source);
            std::__cxx11::string::~string((string *)&licInfo);
            pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                               (&local_198,pcVar7,"to_date",FullLicenseInfo::UNUSED_TIME,(bool *)0x0
                               );
            std::__cxx11::string::string((string *)&licInfo,pcVar6,(allocator *)&client_signature);
            trim_copy(&to_date,&licInfo.source);
            std::__cxx11::string::~string((string *)&licInfo);
            pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                               (&local_198,pcVar7,"client_signature","",(bool *)0x0);
            std::__cxx11::string::string((string *)&licInfo,pcVar6,(allocator *)&extra_data);
            trim_copy(&client_signature,&licInfo.source);
            std::__cxx11::string::~string((string *)&licInfo);
            local_2a0 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                        GetLongValue(&local_198,pcVar7,"from_sw_version",0,(bool *)0x0);
            local_2a8 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                        GetLongValue(&local_198,pcVar7,"to_sw_version",0,(bool *)0x0);
            pcVar7 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                               (&local_198,pcVar7,"extra_data","",(bool *)0x0);
            std::__cxx11::string::string((string *)&licInfo,pcVar7,(allocator *)&local_218);
            trim_copy(&extra_data,&licInfo.source);
            std::__cxx11::string::~string((string *)&licInfo);
            std::__cxx11::string::string((string *)&local_218,pcVar4,&local_2c9);
            std::__cxx11::string::string((string *)&local_1d8,(string *)&from_date);
            std::__cxx11::string::string((string *)&local_1b8,(string *)&to_date);
            FullLicenseInfo::FullLicenseInfo
                      (&licInfo,eventParameter,local_2b8,&local_218,(int)local_2c0,&local_1d8,
                       &local_1b8,&client_signature,(uint)local_2a0,(uint)local_2a8,&extra_data);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_218);
            std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
            push_back(local_2b0,&licInfo);
            FullLicenseInfo::~FullLicenseInfo(&licInfo);
            std::__cxx11::string::~string((string *)&extra_data);
            std::__cxx11::string::~string((string *)&client_signature);
            std::__cxx11::string::~string((string *)&to_date);
            uVar8 = std::__cxx11::string::~string((string *)&from_date);
            local_2c0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
            bVar1 = true;
            bVar9 = true;
          }
        }
      }
    }
    if (!bVar9) {
      EventRegistry::turnEventIntoError(local_2c8,FILE_FORMAT_NOT_RECOGNIZED);
    }
    if (!bVar1) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,PRODUCT_NOT_LICENSED);
    }
    if ((local_2c0 & 1) == 0) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_MALFORMED);
    }
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl(&local_198);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&diskFiles);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product,
		vector<FullLicenseInfo>& licenseInfoOut) {
	vector<string> diskFiles;
	EventRegistry result = getLicenseDiskFiles(diskFiles);
	if (!result.isGood()) {
		return result;
	}
	bool loadAtLeastOneFile = false;
	bool atLeastOneProductLicensed = false;
	bool atLeastOneLicenseComplete = false;
	CSimpleIniA ini;
	for (auto it = diskFiles.begin(); it != diskFiles.end(); it++) {
		ini.Reset();
		SI_Error rc = ini.LoadFile((*it).c_str());
		if (rc < 0) {
			result.addEvent(FILE_FORMAT_NOT_RECOGNIZED, SVRT_WARN, *it);
			continue;
		} else {
			loadAtLeastOneFile = true;
		}
		const char* productNamePtr = product.c_str();
		int sectionSize = ini.GetSectionSize(productNamePtr);
		if (sectionSize <= 0) {
			result.addEvent(PRODUCT_NOT_LICENSED, SVRT_WARN, *it);
			continue;
		} else {
			atLeastOneProductLicensed = true;
		}
		/*
		 *  sw_version_from = (optional int)
		 *  sw_version_to = (optional int)
		 *  from_date = YYYY-MM-DD (optional)
		 *  to_date  = YYYY-MM-DD (optional)
		 *  client_signature = XXXX-XXXX-XXXX-XXXX (optional string 16)
		 *  license_signature = XXXXXXXXXX (mandatory, 1024)
		 *  application_data = xxxxxxxxx (optional string 16)
		 */
		const char * license_signature = ini.GetValue(productNamePtr,
				"license_signature", NULL);
		long license_version = ini.GetLongValue(productNamePtr,
				"license_version", -1);
		if (license_signature != NULL && license_version > 0) {
			string from_date = trim_copy(
					ini.GetValue(productNamePtr, "from_date",
							FullLicenseInfo::UNUSED_TIME));
			string to_date = trim_copy(
					ini.GetValue(productNamePtr, "to_date",
							FullLicenseInfo::UNUSED_TIME));
			string client_signature = trim_copy(
					ini.GetValue(productNamePtr, "client_signature", ""));
			/*client_signature.erase(
			 std::remove(client_signature.begin(), client_signature.end(), '-'),
			 client_signature.end());*/
			int from_sw_version = ini.GetLongValue(productNamePtr,
					"from_sw_version",
					FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			int to_sw_version = ini.GetLongValue(productNamePtr,
					"to_sw_version", FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			string extra_data = trim_copy(
					ini.GetValue(productNamePtr, "extra_data", ""));
			FullLicenseInfo licInfo(*it, product, license_signature,
					(int) license_version, from_date, to_date, client_signature,
					from_sw_version, to_sw_version, extra_data);
			licenseInfoOut.push_back(licInfo);
			atLeastOneLicenseComplete = true;
		} else {
			result.addEvent(LICENSE_MALFORMED, SVRT_WARN, *it);
		}
	}
	if (!loadAtLeastOneFile) {
		result.turnEventIntoError(FILE_FORMAT_NOT_RECOGNIZED);
	}
	if (!atLeastOneProductLicensed) {
		result.turnEventIntoError(PRODUCT_NOT_LICENSED);
	}
	if (!atLeastOneLicenseComplete) {
		result.turnEventIntoError(LICENSE_MALFORMED);
	}
	return result;
}